

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaPIllegalFacetListUnionErr
               (xmlSchemaParserCtxtPtr ctxt,xmlParserErrors error,xmlSchemaTypePtr type,
               xmlSchemaFacetPtr facet)

{
  xmlNodePtr node;
  xmlChar *str1;
  xmlParserErrors code;
  xmlSchemaParserCtxtPtr ctxt_00;
  xmlChar *str2;
  xmlChar *local_30;
  xmlChar *des;
  xmlSchemaFacetPtr facet_local;
  xmlSchemaTypePtr type_local;
  xmlSchemaParserCtxtPtr pxStack_10;
  xmlParserErrors error_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  local_30 = (xmlChar *)0x0;
  des = (xmlChar *)facet;
  facet_local = (xmlSchemaFacetPtr)type;
  type_local._4_4_ = error;
  pxStack_10 = ctxt;
  xmlSchemaFormatItemForReport(&local_30,(xmlChar *)0x0,(xmlSchemaBasicItemPtr)type,type->node);
  ctxt_00 = pxStack_10;
  code = type_local._4_4_;
  str1 = local_30;
  node = *(xmlNodePtr *)(facet_local + 1);
  str2 = xmlSchemaFacetTypeToString(*(xmlSchemaTypeType *)des);
  xmlSchemaPErr(ctxt_00,node,code,"%s: The facet \'%s\' is not allowed.\n",str1,str2);
  if (local_30 != (xmlChar *)0x0) {
    (*xmlFree)(local_30);
  }
  return;
}

Assistant:

static void
xmlSchemaPIllegalFacetListUnionErr(xmlSchemaParserCtxtPtr ctxt,
			  xmlParserErrors error,
			  xmlSchemaTypePtr type,
			  xmlSchemaFacetPtr facet)
{
    xmlChar *des = NULL;

    xmlSchemaFormatItemForReport(&des, NULL, WXS_BASIC_CAST type,
	type->node);
    xmlSchemaPErr(ctxt, type->node, error,
	"%s: The facet '%s' is not allowed.\n",
	BAD_CAST des, xmlSchemaFacetTypeToString(facet->type));
    FREE_AND_NULL(des);
}